

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

bool QUtil::is_number(char *p)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  cVar1 = *p;
  if (cVar1 == '\0') {
    return false;
  }
  if ((cVar1 == '-') || (cVar1 == '+')) {
    p = p + 1;
  }
  bVar4 = false;
  bVar3 = false;
  do {
    cVar1 = *p;
    if (cVar1 == '.') {
      bVar2 = true;
      if (bVar4) {
        return false;
      }
    }
    else {
      if (cVar1 == '\0') {
        return bVar3;
      }
      bVar3 = true;
      bVar2 = bVar4;
      if (9 < (byte)(cVar1 - 0x30U)) {
        return false;
      }
    }
    bVar4 = bVar2;
    p = p + 1;
  } while( true );
}

Assistant:

bool
QUtil::is_number(char const* p)
{
    // No longer used by qpdf.

    // ^[\+\-]?(\.\d*|\d+(\.\d*)?)$
    if (!*p) {
        return false;
    }
    if ((*p == '-') || (*p == '+')) {
        ++p;
    }
    bool found_dot = false;
    bool found_digit = false;
    for (; *p; ++p) {
        if (*p == '.') {
            if (found_dot) {
                // only one dot
                return false;
            }
            found_dot = true;
        } else if (util::is_digit(*p)) {
            found_digit = true;
        } else {
            return false;
        }
    }
    return found_digit;
}